

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O1

QString * convertToUnicode(QString *__return_storage_ptr__,QString *asciiDomain,
                          AceProcessingOptions options)

{
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  int iVar4;
  qsizetype qVar5;
  long lVar6;
  long in_FS_OFFSET;
  DomainValidityChecker checker;
  QString local_98;
  QString local_78;
  DomainValidityChecker local_5b;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  lVar6 = (asciiDomain->d).size;
  qVar5 = 0;
  if (0 < lVar6) {
    qVar5 = lVar6;
  }
  QString::reallocData(&local_58,qVar5,KeepSize);
  if ((&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) &&
     (*(qsizetype *)((long)local_58.d.d + 8) != 0)) {
    *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  lVar6 = 0;
  local_5b.domainNameIsBidi = false;
  local_5b.hadBidiErrors = false;
  local_5b.ignoreBidiErrors = false;
  do {
    qVar5 = QString::indexOf(asciiDomain,(QChar)0x2e,lVar6,CaseSensitive);
    if (qVar5 == -1) {
      qVar5 = (asciiDomain->d).size;
    }
    if (qVar5 - lVar6 == 0) {
      iVar4 = 3;
      if (qVar5 != (asciiDomain->d).size) {
LAB_00266fee:
        iVar4 = 3;
        if (qVar5 != (asciiDomain->d).size) {
          QString::append(&local_58,(QChar)0x2e);
          lVar6 = qVar5 + 1;
          iVar4 = 0;
        }
      }
    }
    else {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString(&local_78,(QChar *)((asciiDomain->d).ptr + lVar6),qVar5 - lVar6);
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qt_punycodeDecoder(&local_98,&local_78);
      if ((undefined1 *)local_98.d.size != (undefined1 *)0x0) {
        bVar3 = anon_unknown.dwarf_54185d::DomainValidityChecker::checkLabel
                          (&local_5b,&local_98,options);
        if (bVar3) {
          QString::append(&local_58,&local_98);
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_00266fee;
        }
      }
      pDVar1 = (asciiDomain->d).d;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (asciiDomain->d).ptr;
      (__return_storage_ptr__->d).size = (asciiDomain->d).size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar4 = 1;
    }
    qVar5 = local_58.d.size;
    pcVar2 = local_58.d.ptr;
    pDVar1 = local_58.d.d;
    if (iVar4 != 0) {
      if (iVar4 == 3) {
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).d = pDVar1;
        (__return_storage_ptr__->d).ptr = pcVar2;
        local_58.d.size = 0;
        (__return_storage_ptr__->d).size = qVar5;
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

static QString convertToUnicode(const QString &asciiDomain, QUrl::AceProcessingOptions options)
{
    QString result;
    result.reserve(asciiDomain.size());
    qsizetype lastIdx = 0;

    DomainValidityChecker checker;

    while (true) {
        auto idx = asciiDomain.indexOf(u'.', lastIdx);
        if (idx == -1)
            idx = asciiDomain.size();

        const auto labelLength = idx - lastIdx;
        if (labelLength == 0) {
            if (idx == asciiDomain.size())
                break;
        } else {
            const auto label = asciiDomain.sliced(lastIdx, labelLength);
            const auto unicodeLabel = qt_punycodeDecoder(label);

            if (unicodeLabel.isEmpty())
                return asciiDomain;

            if (!checker.checkLabel(unicodeLabel, options))
                return asciiDomain;

            result.append(unicodeLabel);
        }

        if (idx == asciiDomain.size())
            break;

        lastIdx = idx + 1;
        result += u'.';
    }
    return result;
}